

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

VectorXd __thiscall Util::StdVec2Eigen(Util *this,vector<double,_std::allocator<double>_> *vec1)

{
  pointer pdVar1;
  pointer pdVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  Index in_RDX;
  Index extraout_RDX;
  long lVar6;
  uint uVar7;
  VectorXd VVar8;
  
  pdVar1 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  uVar7 = (uint)((ulong)((long)pdVar2 - (long)pdVar1) >> 3);
  lVar6 = (long)(int)uVar7;
  if ((int)uVar7 < 1) {
    *(long *)(this + 8) = lVar6;
  }
  else {
    pvVar3 = malloc(lVar6 * 8);
    if (pvVar3 == (void *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::ios::widen;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)this = pvVar3;
    *(long *)(this + 8) = lVar6;
    uVar5 = 0;
    do {
      *(double *)((long)pvVar3 + uVar5 * 8) = pdVar1[uVar5];
      uVar5 = uVar5 + 1;
      in_RDX = extraout_RDX;
    } while ((uVar7 & 0x7fffffff) != uVar5);
  }
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = in_RDX;
  VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd StdVec2Eigen(std::vector<double> vec1){

		//locals
		int n = vec1.size();
		Eigen::VectorXd vec2(n);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;

	}